

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_sound_envs.cxx
# Opt level: O3

void __thiscall temp_box::collect(temp_box *this,cf_face *face,cf_vertex_vec *verts)

{
  long lVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  uint uVar7;
  pointer pcVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ulong uVar11;
  ulong uVar12;
  undefined1 *puVar13;
  undefined1 *puVar14;
  long lVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 local_38 [8];
  undefined8 uStack_30;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  undefined8 local_18;
  
  if ((face->field_1).dummy >> 0x10 != (uint)this->inner) {
    __assert_fail("inner == face.sector",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_tools_sound_envs.cxx"
                  ,0x36,"void temp_box::collect(const cf_face &, const cf_vertex_vec &)");
  }
  if (((face->field_1).dummy & 0x3fff) == (uint)this->outer) {
    if (this->state != 1) {
      uVar7 = this->base_idx;
      puVar13 = (undefined1 *)((long)&face->field_0 + 0x14);
      puVar14 = (undefined1 *)((long)&face->field_0 + 0x10);
      uVar12 = 5;
      uVar11 = 4;
      lVar15 = 2;
      do {
        if (lVar15 == -1) {
          return;
        }
        puVar13 = puVar13 + -4;
        uVar12 = uVar12 - 1;
        puVar14 = puVar14 + -4;
        uVar11 = uVar11 - 1;
        lVar1 = lVar15 * 4;
        lVar15 = lVar15 + -1;
      } while (*(uint *)((long)&face->field_0 + lVar1) != uVar7);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = uVar11;
      pcVar8 = (verts->super__Vector_base<xray_re::cf_vertex,_std::allocator<xray_re::cf_vertex>_>).
               _M_impl.super__Vector_impl_data._M_start;
      uVar4 = *(undefined8 *)
               ((long)&pcVar8[*(uint *)(puVar14 +
                                       (SUB168(auVar9 * ZEXT816(0xaaaaaaaaaaaaaaab),8) * 2 &
                                       0xfffffffffffffffcU) * -3)].p.field_0 + 4);
      auVar10._8_8_ = 0;
      auVar10._0_8_ = uVar12;
      fVar2 = pcVar8[uVar7].p.field_0.field_0.x;
      uVar5 = *(undefined8 *)((long)&pcVar8[uVar7].p.field_0 + 4);
      fVar17 = (float)uVar5;
      fVar18 = (float)((ulong)uVar5 >> 0x20);
      local_28 = pcVar8[*(uint *)(puVar14 +
                                 (SUB168(auVar9 * ZEXT816(0xaaaaaaaaaaaaaaab),8) * 2 &
                                 0xfffffffffffffffcU) * -3)].p.field_0.field_0.x - fVar2;
      fStack_24 = (float)uVar4 - fVar17;
      fStack_20 = (float)((ulong)uVar4 >> 0x20) - fVar18;
      fStack_1c = pcVar8[*(uint *)(puVar13 +
                                  (SUB168(auVar10 * ZEXT816(0xaaaaaaaaaaaaaaab),8) * 2 &
                                  0xfffffffffffffffcU) * -3)].p.field_0.field_0.x - fVar2;
      uVar4 = *(undefined8 *)
               ((long)&pcVar8[*(uint *)(puVar13 +
                                       (SUB168(auVar10 * ZEXT816(0xaaaaaaaaaaaaaaab),8) * 2 &
                                       0xfffffffffffffffcU) * -3)].p.field_0 + 4);
      local_18 = CONCAT44((float)((ulong)uVar4 >> 0x20) - fVar18,(float)uVar4 - fVar17);
      lVar15 = 0x18;
      do {
        fVar2 = (this->xform).field_0.field_0._11;
        fVar17 = (this->xform).field_0.field_0._12;
        local_38 = *(undefined1 (*) [8])(local_38 + lVar15 + 4);
        fVar19 = (float)((ulong)local_38 >> 0x20);
        uStack_30._0_4_ = 0;
        uStack_30._4_4_ = 0;
        fVar18 = (this->xform).field_0.field_0._13;
        fVar3 = *(float *)((long)&uStack_30 + lVar15 + 4);
        fVar20 = fVar3 * fVar3 + (float)local_38._0_4_ * (float)local_38._0_4_ + fVar19 * fVar19;
        fVar16 = (fVar18 * fVar18 + fVar2 * fVar2 + fVar17 * fVar17) * fVar20;
        if (fVar16 < 0.0) {
          uStack_30 = 0;
          fVar16 = sqrtf(fVar16);
        }
        else {
          fVar16 = SQRT(fVar16);
          local_38._4_4_ = fVar19;
        }
        fVar16 = (fVar18 * fVar3 + fVar2 * (float)local_38._0_4_ + fVar17 * fVar19) / fVar16;
        if ((float)(~-(uint)(fVar16 < 0.0) & (uint)fVar16 |
                   (uint)(0.0 - fVar16) & -(uint)(fVar16 < 0.0)) < 0.001) {
          fVar2 = (this->xform).field_0.field_0._21;
          fVar17 = (this->xform).field_0.field_0._22;
          fVar18 = (this->xform).field_0.field_0._23;
          fVar20 = fVar20 * (fVar18 * fVar18 + fVar2 * fVar2 + fVar17 * fVar17);
          if (fVar20 < 0.0) {
            fVar20 = sqrtf(fVar20);
          }
          else {
            fVar20 = SQRT(fVar20);
          }
          fVar20 = (fVar18 * fVar3 + fVar2 * (float)local_38._0_4_ + fVar19 * fVar17) / fVar20;
          if ((float)(~-(uint)(fVar20 < 0.0) & (uint)fVar20 |
                     (uint)(0.0 - fVar20) & -(uint)(fVar20 < 0.0)) < 0.001) {
            *(ulong *)((long)&(this->xform).field_0 + 0x20) =
                 CONCAT44(local_38._4_4_,local_38._0_4_);
            (this->xform).field_0.field_0._33 = fVar3;
            this->state = 1;
            fVar2 = (this->xform).field_0.field_0._13;
            fVar17 = (this->xform).field_0.field_0._23;
            uVar4 = *(undefined8 *)&(this->xform).field_0;
            uVar5 = *(undefined8 *)((long)&(this->xform).field_0 + 0x10);
            uVar6 = *(undefined8 *)((long)&(this->xform).field_0 + 0x30);
            *(ulong *)((long)&(this->xform).field_0 + 0x30) =
                 CONCAT44((float)((ulong)uVar6 >> 0x20) +
                          ((float)((ulong)uVar5 >> 0x20) + (float)((ulong)uVar4 >> 0x20) +
                          (float)local_38._4_4_) * 0.5,
                          (float)uVar6 + ((float)uVar5 + (float)uVar4 + (float)local_38._0_4_) * 0.5
                         );
            (this->xform).field_0.field_0._43 =
                 (fVar2 + fVar17 + fVar3) * 0.5 + (this->xform).field_0.field_0._43;
            return;
          }
        }
        lVar15 = lVar15 + -0xc;
      } while (lVar15 != 0);
    }
    return;
  }
  __assert_fail("outer == face.material",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_tools_sound_envs.cxx"
                ,0x37,"void temp_box::collect(const cf_face &, const cf_vertex_vec &)");
}

Assistant:

void temp_box::collect(const cf_face& face, const cf_vertex_vec& verts)
{
	// FIXME: this code will not work in a (legal) situation with intersecting
	// sound volumes. So far I am not aware of any real examples, though.
	xr_assert(inner == face.sector);
	xr_assert(outer == face.material);
	if (state == STATE_DONE)
		return;
	for (uint_fast32_t k = 3; k != 0;) {
		if (face.v[--k] != base_idx)
			continue;
		fvector3 edge[2];
		edge[0].sub(verts[face.v[(k+1)%3]].p, verts[face.v[k]].p);
		edge[1].sub(verts[face.v[(k+2)%3]].p, verts[face.v[k]].p);
		for (uint_fast32_t i = 2; i != 0;) {
			--i;
			if (equivalent(xform.i.cosine(edge[i]), 0.f, k_zero_tolerance) &&
					equivalent(xform.j.cosine(edge[i]), 0.f, k_zero_tolerance)) {
				xform.k.set(edge[i]);
				state = STATE_DONE;
				xform.c.add(fvector3().add(xform.i, xform.j).add(xform.k).mul(0.5f));
				return;
			}
		}
		break;
	}
}